

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O0

uint __thiscall llvm::DWARFVerifier::verifyNameIndexAbbrevs(DWARFVerifier *this,NameIndex *NI)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  raw_ostream *prVar5;
  DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
  *this_00;
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  *this_01;
  pair<llvm::NoneType,_bool> pVar6;
  size_type sVar7;
  Index local_34c;
  uint64_t local_348;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
  local_340;
  uint local_2d0;
  Index local_2cc;
  uint64_t local_2c8;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
  local_2c0;
  uint local_24c;
  AttributeEncoding local_248;
  uint64_t local_240;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>_>
  local_238;
  Index local_1c4;
  NoneType local_1c0;
  byte local_1bc;
  AttributeEncoding *local_1b8;
  AttributeEncoding *AttrEnc;
  const_iterator __end2;
  const_iterator __begin2;
  vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
  *__range2;
  SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> Attributes;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
  local_138;
  undefined1 local_c8 [8];
  StringRef TagName;
  Abbrev *Abbrev;
  const_iterator __end1;
  const_iterator __begin1;
  DenseSet<llvm::DWARFDebugNames::Abbrev,_llvm::DWARFDebugNames::AbbrevMapInfo> *__range1;
  uint NumErrors;
  uint64_t local_78;
  formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_> local_70;
  NameIndex *local_20;
  NameIndex *NI_local;
  DWARFVerifier *this_local;
  
  local_20 = NI;
  NI_local = (NameIndex *)this;
  uVar2 = DWARFDebugNames::NameIndex::getLocalTUCount(NI);
  uVar3 = DWARFDebugNames::NameIndex::getForeignTUCount(local_20);
  if (uVar2 + uVar3 == 0) {
    __range1._0_4_ = 0;
    this_00 = &DWARFDebugNames::NameIndex::getAbbrevs(local_20)->
               super_DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
    ;
    join_0x00000010_0x00000000_ =
         (const_iterator)
         detail::
         DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
         ::begin(this_00);
    _Abbrev = (const_iterator)
              detail::
              DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
              ::end(this_00);
    while (bVar1 = detail::
                   DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                   ::ConstIterator::operator!=
                             ((ConstIterator *)&__end1.I.End,(ConstIterator *)&Abbrev), bVar1) {
      TagName.Length =
           (size_t)detail::
                   DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
                   ::ConstIterator::operator*((ConstIterator *)&__end1.I.End);
      _local_c8 = dwarf::TagString((uint)((Abbrev *)TagName.Length)->Tag);
      bVar1 = StringRef::empty((StringRef *)local_c8);
      if (bVar1) {
        prVar5 = warn(this);
        Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count =
             DWARFDebugNames::NameIndex::getUnitOffset(local_20);
        formatv<unsigned_long,_const_unsigned_int_&,_const_llvm::dwarf::Tag_&>
                  (&local_138,
                   "NameIndex @ {0:x}: Abbreviation {1:x} references an unknown tag: {2}.\n",
                   &Attributes.Set._M_t._M_impl.super__Rb_tree_header._M_node_count,
                   (uint *)TagName.Length,(Tag *)(TagName.Length + 4));
        raw_ostream::operator<<(prVar5,&local_138.super_formatv_object_base);
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Tag_&>_>_>
        ::~formatv_object(&local_138);
      }
      SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::SmallSet
                ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__range2);
      this_01 = (vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                 *)(TagName.Length + 8);
      __end2 = std::
               vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
               ::begin(this_01);
      AttrEnc = (AttributeEncoding *)
                std::
                vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>
                ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_llvm::DWARFDebugNames::AttributeEncoding_*,_std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
                                         *)&AttrEnc), bVar1) {
        local_1b8 = __gnu_cxx::
                    __normal_iterator<const_llvm::DWARFDebugNames::AttributeEncoding_*,_std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
                    ::operator*(&__end2);
        local_1c4 = local_1b8->Index;
        pVar6 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::insert
                          ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__range2,
                           &local_1c4);
        local_1c0 = pVar6.first;
        local_1bc = pVar6.second;
        if (((local_1bc ^ 0xff) & 1) == 0) {
          local_248 = *local_1b8;
          uVar4 = verifyNameIndexAttribute(this,local_20,(Abbrev *)TagName.Length,local_248);
          __range1._0_4_ = uVar4 + (uint)__range1;
        }
        else {
          prVar5 = error(this);
          local_240 = DWARFDebugNames::NameIndex::getUnitOffset(local_20);
          formatv<unsigned_long,_const_unsigned_int_&,_const_llvm::dwarf::Index_&>
                    (&local_238,
                     "NameIndex @ {0:x}: Abbreviation {1:x} contains multiple {2} attributes.\n",
                     &local_240,(uint *)TagName.Length,&local_1b8->Index);
          raw_ostream::operator<<(prVar5,&local_238.super_formatv_object_base);
          formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<const_llvm::dwarf::Index_&>_>_>
          ::~formatv_object(&local_238);
          __range1._0_4_ = (uint)__range1 + 1;
        }
        __gnu_cxx::
        __normal_iterator<const_llvm::DWARFDebugNames::AttributeEncoding_*,_std::vector<llvm::DWARFDebugNames::AttributeEncoding,_std::allocator<llvm::DWARFDebugNames::AttributeEncoding>_>_>
        ::operator++(&__end2);
      }
      uVar2 = DWARFDebugNames::NameIndex::getCUCount(local_20);
      bVar1 = false;
      if (1 < uVar2) {
        local_24c = 1;
        sVar7 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
                          ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__range2,
                           &local_24c);
        bVar1 = sVar7 == 0;
      }
      if (bVar1) {
        prVar5 = error(this);
        local_2c8 = DWARFDebugNames::NameIndex::getUnitOffset(local_20);
        local_2cc = DW_IDX_compile_unit;
        formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index>
                  (&local_2c0,
                   "NameIndex @ {0:x}: Indexing multiple compile units and abbreviation {1:x} has no {2} attribute.\n"
                   ,&local_2c8,(uint *)TagName.Length,&local_2cc);
        raw_ostream::operator<<(prVar5,&local_2c0.super_formatv_object_base);
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
        ::~formatv_object(&local_2c0);
        __range1._0_4_ = (uint)__range1 + 1;
      }
      local_2d0 = 3;
      sVar7 = SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::count
                        ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__range2,
                         &local_2d0);
      if (sVar7 == 0) {
        prVar5 = error(this);
        local_348 = DWARFDebugNames::NameIndex::getUnitOffset(local_20);
        local_34c = DW_IDX_die_offset;
        formatv<unsigned_long,_const_unsigned_int_&,_llvm::dwarf::Index>
                  (&local_340,"NameIndex @ {0:x}: Abbreviation {1:x} has no {2} attribute.\n",
                   &local_348,(uint *)TagName.Length,&local_34c);
        raw_ostream::operator<<(prVar5,&local_340.super_formatv_object_base);
        formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>,_llvm::detail::provider_format_adapter<const_unsigned_int_&>,_llvm::detail::provider_format_adapter<llvm::dwarf::Index>_>_>
        ::~formatv_object(&local_340);
        __range1._0_4_ = (uint)__range1 + 1;
      }
      SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_>::~SmallSet
                ((SmallSet<unsigned_int,_5U,_std::less<unsigned_int>_> *)&__range2);
      detail::
      DenseSetImpl<llvm::DWARFDebugNames::Abbrev,_llvm::DenseMap<llvm::DWARFDebugNames::Abbrev,_llvm::detail::DenseSetEmpty,_llvm::DWARFDebugNames::AbbrevMapInfo,_llvm::detail::DenseSetPair<llvm::DWARFDebugNames::Abbrev>_>,_llvm::DWARFDebugNames::AbbrevMapInfo>
      ::ConstIterator::operator++((ConstIterator *)&__end1.I.End);
    }
    this_local._4_4_ = (uint)__range1;
  }
  else {
    prVar5 = warn(this);
    local_78 = DWARFDebugNames::NameIndex::getUnitOffset(local_20);
    formatv<unsigned_long>
              (&local_70,
               "Name Index @ {0:x}: Verifying indexes of type units is not currently supported.\n",
               &local_78);
    raw_ostream::operator<<(prVar5,&local_70.super_formatv_object_base);
    formatv_object<std::tuple<llvm::detail::provider_format_adapter<unsigned_long>_>_>::
    ~formatv_object(&local_70);
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

unsigned
DWARFVerifier::verifyNameIndexAbbrevs(const DWARFDebugNames::NameIndex &NI) {
  if (NI.getLocalTUCount() + NI.getForeignTUCount() > 0) {
    warn() << formatv("Name Index @ {0:x}: Verifying indexes of type units is "
                      "not currently supported.\n",
                      NI.getUnitOffset());
    return 0;
  }

  unsigned NumErrors = 0;
  for (const auto &Abbrev : NI.getAbbrevs()) {
    StringRef TagName = dwarf::TagString(Abbrev.Tag);
    if (TagName.empty()) {
      warn() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} references an "
                        "unknown tag: {2}.\n",
                        NI.getUnitOffset(), Abbrev.Code, Abbrev.Tag);
    }
    SmallSet<unsigned, 5> Attributes;
    for (const auto &AttrEnc : Abbrev.Attributes) {
      if (!Attributes.insert(AttrEnc.Index).second) {
        error() << formatv("NameIndex @ {0:x}: Abbreviation {1:x} contains "
                           "multiple {2} attributes.\n",
                           NI.getUnitOffset(), Abbrev.Code, AttrEnc.Index);
        ++NumErrors;
        continue;
      }
      NumErrors += verifyNameIndexAttribute(NI, Abbrev, AttrEnc);
    }

    if (NI.getCUCount() > 1 && !Attributes.count(dwarf::DW_IDX_compile_unit)) {
      error() << formatv("NameIndex @ {0:x}: Indexing multiple compile units "
                         "and abbreviation {1:x} has no {2} attribute.\n",
                         NI.getUnitOffset(), Abbrev.Code,
                         dwarf::DW_IDX_compile_unit);
      ++NumErrors;
    }
    if (!Attributes.count(dwarf::DW_IDX_die_offset)) {
      error() << formatv(
          "NameIndex @ {0:x}: Abbreviation {1:x} has no {2} attribute.\n",
          NI.getUnitOffset(), Abbrev.Code, dwarf::DW_IDX_die_offset);
      ++NumErrors;
    }
  }
  return NumErrors;
}